

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix-ops.impl.hpp
# Opt level: O0

Mat * pobr::imgProcessing::utils::matrixOps::
      applyKernel<cv::Vec<unsigned_char,3>,std::array<double,3ul>,double>
                (Mat *img,Mat *kernel,array<double,_3UL> accumulatorInit,
                function<std::array<double,_3UL>_(const_unsigned_long_&,_const_unsigned_long_&,_std::array<double,_3UL>_&,_const_cv::Vec<unsigned_char,_3>_&,_const_double_&)>
                *reducer,function<void_(const_unsigned_long_&,_const_unsigned_long_&,_std::array<double,_3UL>_&,_cv::Vec<unsigned_char,_3>_&,_const_cv::Mat_&)>
                         *applicator)

{
  int iVar1;
  function<void_(const_unsigned_long_&,_const_unsigned_long_&,_std::array<double,_3UL>_&,_cv::Vec<unsigned_char,_3>_&,_const_cv::Mat_&)>
  *in_R8;
  anon_class_96_12_04f0a8a3 local_d0;
  function<void_(const_unsigned_long_&,_const_unsigned_long_&)> local_70;
  uint local_4c;
  uint local_48;
  uint kernelOffsetX;
  uint kernelOffsetY;
  uint endCol;
  uint endRow;
  uint initCol;
  uint initRow;
  function<void_(const_unsigned_long_&,_const_unsigned_long_&,_std::array<double,_3UL>_&,_cv::Vec<unsigned_char,_3>_&,_const_cv::Mat_&)>
  *applicator_local;
  function<std::array<double,_3UL>_(const_unsigned_long_&,_const_unsigned_long_&,_std::array<double,_3UL>_&,_const_cv::Vec<unsigned_char,_3>_&,_const_double_&)>
  *reducer_local;
  Mat *kernel_local;
  Mat *img_local;
  Mat *resultImg;
  
  initCol._3_1_ = 0;
  _initRow = in_R8;
  applicator_local = applicator;
  reducer_local = reducer;
  kernel_local = kernel;
  img_local = img;
  cv::Mat::clone();
  iVar1 = *(int *)((long)&(reducer_local->super__Function_base)._M_functor + 8);
  endRow = (iVar1 + -1) - (iVar1 + -1 >> 0x1f) >> 1;
  iVar1 = *(int *)((long)&(reducer_local->super__Function_base)._M_functor + 0xc);
  endCol = (iVar1 + -1) - (iVar1 + -1 >> 0x1f) >> 1;
  kernelOffsetY = ~endRow + *(int *)(kernel_local + 8);
  kernelOffsetX = ~endCol + *(int *)(kernel_local + 0xc);
  iVar1 = *(int *)((long)&(reducer_local->super__Function_base)._M_functor + 8);
  local_48 = (iVar1 + -1) - (iVar1 + -1 >> 0x1f) >> 1;
  iVar1 = *(int *)((long)&(reducer_local->super__Function_base)._M_functor + 0xc);
  local_4c = (iVar1 + -1) - (iVar1 + -1 >> 0x1f) >> 1;
  local_d0.initCol = &endCol;
  local_d0.initRow = &endRow;
  local_d0.endCol = &kernelOffsetX;
  local_d0.endRow = &kernelOffsetY;
  local_d0.kernel = (Mat *)reducer_local;
  local_d0.img = kernel_local;
  local_d0.kernelOffsetY = &local_48;
  local_d0.kernelOffsetX = &local_4c;
  local_d0.reducer =
       (function<std::array<double,_3UL>_(const_unsigned_long_&,_const_unsigned_long_&,_std::array<double,_3UL>_&,_const_cv::Vec<unsigned_char,_3>_&,_const_double_&)>
        *)applicator_local;
  local_d0.applicator = _initRow;
  local_d0.accumulatorInit = &accumulatorInit;
  local_d0.resultImg = img;
  std::function<void(unsigned_long_const&,unsigned_long_const&)>::
  function<pobr::imgProcessing::utils::matrixOps::applyKernel<cv::Vec<unsigned_char,3>,std::array<double,3ul>,double>(cv::Mat_const&,cv::Mat_const&,std::array<double,3ul>,std::function<std::array<double,3ul>(unsigned_long_const&,unsigned_long_const&,std::array<double,3ul>&,cv::Vec<unsigned_char,3>const&,double_const&)>const&,std::function<void(unsigned_long_const&,unsigned_long_const&,std::array<double,3ul>&,cv::Vec<unsigned_char,3>&,cv::Mat_const&)>const&)::_lambda(unsigned_long_const&,unsigned_long_const&)_1_,void>
            ((function<void(unsigned_long_const&,unsigned_long_const&)> *)&local_70,&local_d0);
  forEachPixel(img,&local_70);
  std::function<void_(const_unsigned_long_&,_const_unsigned_long_&)>::~function(&local_70);
  return img;
}

Assistant:

cv::Mat
matrixOps::applyKernel(
    const cv::Mat& img,
    const cv::Mat& kernel,
    Acc accumulatorInit,
    const std::function<Acc(const uint64_t& x, const uint64_t& y, Acc& accumulator, const PixelClass& pixel, const KernelValue& kernelValue)>& reducer,
    const std::function<void(const uint64_t& x, const uint64_t& y, Acc& accumulator, PixelClass& pixel, const cv::Mat& img)>& applicator
)
{
    // Uses edge cropping
    auto resultImg = img.clone();

    const unsigned int initRow = 0 + ((kernel.rows - 1) / 2);
    const unsigned int initCol = 0 + ((kernel.cols - 1) / 2);

    const unsigned int endRow = (img.rows - 1) - initRow;
    const unsigned int endCol = (img.cols - 1) - initCol;

    const unsigned int kernelOffsetY = 0 + ((kernel.rows - 1) / 2);
    const unsigned int kernelOffsetX = 0 + ((kernel.cols - 1) / 2);

    matrixOps::forEachPixel(
        resultImg,
        [&](const uint64_t& x, const uint64_t& y) -> void
        {
            if (x < initCol) {
                return;
            }
            if (y < initRow) {
                return;
            }
            if (x > endCol) {
                return;
            }
            if (y > endRow) {
                return;
            }

            Acc value = matrixOps::reduceEachPixel<Acc>(
                kernel,
                accumulatorInit,
                [&](const uint64_t& kernelX, const uint64_t& kernelY, Acc& accumulator) -> Acc
                {
                    auto& thisKernelValue = kernel.at<KernelValue>(kernelY, kernelX);
                    auto& adjacentPixel = img.at<PixelClass>(
                        y - kernelOffsetY + kernelY,
                        x - kernelOffsetX + kernelX
                    );

                    return reducer(x, y, accumulator, adjacentPixel, thisKernelValue);
                }
            );

            auto& thisPixel = resultImg.at<PixelClass>(y, x);

            applicator(x, y, value, thisPixel, img);
        }
    );

    return resultImg;
}